

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

void Acb_NtkPrintCecStats(Acb_Ntk_t *pNtk)

{
  Acb_ObjType_t AVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int i;
  
  uVar4 = 0;
  uVar3 = 0;
  for (i = 1; i < (pNtk->vObjType).nSize; i = i + 1) {
    AVar1 = Acb_ObjType(pNtk,i);
    if (AVar1 != ABC_OPER_NONE) {
      iVar2 = Acb_ObjIsCio(pNtk,i);
      if (iVar2 == 0) {
        AVar1 = Acb_ObjType(pNtk,i);
        if (AVar1 == ABC_OPER_TRI) {
          uVar4 = uVar4 + 1;
        }
        else {
          AVar1 = Acb_ObjType(pNtk,i);
          uVar3 = uVar3 + (AVar1 == ABC_OPER_BIT_MUX);
        }
      }
    }
  }
  printf("PI = %6d  ",(ulong)(uint)(pNtk->vCis).nSize);
  printf("PO = %6d  ",(ulong)(uint)(pNtk->vCos).nSize);
  printf("Obj = %6d  ",(ulong)((pNtk->vObjType).nSize - 1));
  printf("DC = %4d  ",(ulong)uVar4);
  printf("Mux = %4d  ",(ulong)uVar3);
  putchar(10);
  return;
}

Assistant:

void Acb_NtkPrintCecStats( Acb_Ntk_t * pNtk )
{
    int iObj, nDcs = 0, nMuxes = 0;
    Acb_NtkForEachNode( pNtk, iObj )
        if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_TRI )
            nDcs++;
        else if ( Acb_ObjType( pNtk, iObj ) == ABC_OPER_BIT_MUX )
            nMuxes++;

    printf( "PI = %6d  ",  Acb_NtkCiNum(pNtk) );
    printf( "PO = %6d  ",  Acb_NtkCoNum(pNtk) );
    printf( "Obj = %6d  ", Acb_NtkObjNum(pNtk) );
    printf( "DC = %4d  ",  nDcs );
    printf( "Mux = %4d  ", nMuxes );
    printf( "\n" );
}